

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::DrawLine(Vector2f *a,Vector2f *b,Color *color,float thickness)

{
  ImVec2 IVar1;
  ImU32 col;
  ImDrawList *this;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec4 local_30;
  
  this = GetWindowDrawList();
  IVar1 = GetCursorScreenPos();
  local_38.x = (*a).x + IVar1.x;
  local_38.y = (*a).y + IVar1.y;
  local_40.x = (*b).x + IVar1.x;
  local_40.y = (*b).y + IVar1.y;
  local_30 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*color);
  col = ColorConvertFloat4ToU32(&local_30);
  ImDrawList::AddLine(this,&local_38,&local_40,col,thickness);
  return;
}

Assistant:

void DrawLine(const sf::Vector2f& a, const sf::Vector2f& b, const sf::Color& color,
              float thickness) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImVec2 pos = ImGui::GetCursorScreenPos();
    draw_list->AddLine(ImVec2(a.x + pos.x, a.y + pos.y), ImVec2(b.x + pos.x, b.y + pos.y),
                       ColorConvertFloat4ToU32(toImColor(color)), thickness);
}